

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_spiff_header.cpp
# Opt level: O1

charls_jpegls_errc
charls_validate_spiff_header(charls_spiff_header *spiff_header,charls_frame_info *frame_info)

{
  charls_jpegls_errc cVar1;
  int iVar2;
  
  cVar1 = invalid_spiff_header;
  if (spiff_header->compression_type != jpeg_ls) {
    return invalid_spiff_header;
  }
  if (spiff_header->profile_id != none) {
    return invalid_spiff_header;
  }
  if (dots_per_centimeter < spiff_header->resolution_units) {
    return invalid_spiff_header;
  }
  if (spiff_header->horizontal_resolution == 0) {
    return invalid_spiff_header;
  }
  if (spiff_header->vertical_resolution == 0) {
    return invalid_spiff_header;
  }
  if (spiff_header->component_count != frame_info->component_count) {
    return invalid_spiff_header;
  }
  switch(spiff_header->color_space) {
  case ycbcr_itu_bt_709_video:
  case ycbcr_itu_bt_601_1_rgb:
  case ycbcr_itu_bt_601_1_video:
  case photo_ycc:
  case rgb:
  case cmy:
  case cie_lab:
    iVar2 = 3;
    break;
  case none:
    goto switchD_001255e2_caseD_2;
  default:
    goto switchD_001255e2_caseD_5;
  case grayscale:
    iVar2 = 1;
    break;
  case cmyk:
  case ycck:
    iVar2 = 4;
  }
  if (spiff_header->component_count == iVar2) {
switchD_001255e2_caseD_2:
    if ((spiff_header->bits_per_sample == frame_info->bits_per_sample) &&
       (spiff_header->height == frame_info->height)) {
      cVar1 = invalid_spiff_header;
      if (spiff_header->width == frame_info->width) {
        cVar1 = OK;
      }
    }
  }
switchD_001255e2_caseD_5:
  return cVar1;
}

Assistant:

bool is_valid_spiff_header(const spiff_header& header, const charls::frame_info& frame_info) noexcept
{
    if (header.compression_type != spiff_compression_type::jpeg_ls)
        return false;

    if (header.profile_id != spiff_profile_id::none)
        return false;

    if (!is_valid_resolution_units(header.resolution_units))
        return false;

    if (header.horizontal_resolution == 0 || header.vertical_resolution == 0)
        return false;

    if (header.component_count != frame_info.component_count)
        return false;

    if (!is_valid_color_space(header.color_space, header.component_count))
        return false;

    if (header.bits_per_sample != frame_info.bits_per_sample)
        return false;

    if (header.height != frame_info.height)
        return false;

    if (header.width != frame_info.width)
        return false;

    return true;
}